

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zutil.c
# Opt level: O1

void zPrint_CompCol_Matrix(char *what,SuperMatrix *A)

{
  uint uVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  printf("\nCompCol matrix %s:\n",what);
  printf("Stype %d, Dtype %d, Mtype %d\n",(ulong)A->Stype,(ulong)A->Dtype,(ulong)A->Mtype);
  uVar1 = A->ncol;
  piVar2 = (int *)A->Store;
  lVar7 = *(long *)(piVar2 + 2);
  printf("nrow %d, ncol %d, nnz %ld\n",(ulong)(uint)A->nrow,(ulong)uVar1,(long)*piVar2);
  printf("nzval: ");
  lVar5 = (long)(int)uVar1;
  if (0 < *(int *)(*(long *)(piVar2 + 6) + lVar5 * 4)) {
    lVar4 = 0;
    do {
      printf("%f  ",*(undefined8 *)(lVar7 + lVar4 * 8));
      lVar4 = lVar4 + 1;
      lVar3 = (long)*(int *)(*(long *)(piVar2 + 6) + lVar5 * 4);
    } while (SBORROW8(lVar4,lVar3 * 2) != lVar4 + lVar3 * -2 < 0);
  }
  printf("\nrowind: ");
  if (0 < *(int *)(*(long *)(piVar2 + 6) + lVar5 * 4)) {
    lVar7 = 0;
    do {
      printf("%ld  ",(long)*(int *)(*(long *)(piVar2 + 4) + lVar7 * 4));
      lVar7 = lVar7 + 1;
    } while (lVar7 < *(int *)(*(long *)(piVar2 + 6) + lVar5 * 4));
  }
  printf("\ncolptr: ");
  if (-1 < (int)uVar1) {
    uVar6 = 0;
    do {
      printf("%ld  ",(long)*(int *)(*(long *)(piVar2 + 6) + uVar6 * 4));
      uVar6 = uVar6 + 1;
    } while (uVar1 + 1 != uVar6);
  }
  putchar(10);
  fflush(_stdout);
  return;
}

Assistant:

void
zPrint_CompCol_Matrix(char *what, SuperMatrix *A)
{
    NCformat     *Astore;
    register int_t i;
    register int n;
    double       *dp;
    
    printf("\nCompCol matrix %s:\n", what);
    printf("Stype %d, Dtype %d, Mtype %d\n", A->Stype,A->Dtype,A->Mtype);
    n = A->ncol;
    Astore = (NCformat *) A->Store;
    dp = (double *) Astore->nzval;
    printf("nrow %d, ncol %d, nnz %ld\n", (int)A->nrow, (int)A->ncol, (long)Astore->nnz);
    printf("nzval: ");
    for (i = 0; i < 2*Astore->colptr[n]; ++i) printf("%f  ", dp[i]);
    printf("\nrowind: ");
    for (i = 0; i < Astore->colptr[n]; ++i) printf("%ld  ", (long)Astore->rowind[i]);
    printf("\ncolptr: ");
    for (i = 0; i <= n; ++i) printf("%ld  ", (long)Astore->colptr[i]);
    printf("\n");
    fflush(stdout);
}